

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,QualifiedIdentifier *o)

{
  pointer pPVar1;
  PathSection *p;
  pointer pPVar2;
  
  pPVar1 = (o->pathSections).
           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (o->pathSections).
                super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    replaceExpression(this,&pPVar2->specialisationArgs);
  }
  return &o->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::QualifiedIdentifier& o)
    {
        for (auto& p : o.pathSections)
            replaceExpression (p.specialisationArgs);

        return o;
    }